

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall Instance::computeLengthConstraint(Instance *this,Train *train)

{
  long lVar1;
  int iVar2;
  pointer pvVar3;
  pointer ppEVar4;
  ulong uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  pointer ppEVar8;
  ulong uVar9;
  ulong uVar10;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *__x;
  ulong uVar11;
  ast *this_00;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  expr_vector pathVars;
  expr_vector leftNetwork;
  ast local_80;
  vector<z3::expr,_std::allocator<z3::expr>_> *local_70;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *local_68;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *local_60;
  ulong local_58;
  ast local_50;
  expr_vector lengthHot;
  
  uVar14 = (ulong)(train->start).arrivalTime;
  local_70 = &this->constraints;
  do {
    if (this->maxTimeSteps <= uVar14) {
      return;
    }
    z3::ast_vector_tpl<z3::expr>::ast_vector_tpl(&lengthHot,this->c);
    pvVar3 = (this->trainPaths).
             super__Vector_base<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>,_std::allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_68 = *(pointer *)
                ((long)&pvVar3[train->id].
                        super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
    __x = pvVar3[train->id].
          super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    while (__x != local_68) {
      local_60 = __x;
      std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::vector
                ((vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)&leftNetwork,__x);
      uVar12 = 1;
      uVar13 = 0;
      while( true ) {
        uVar5 = (long)leftNetwork.m_vector - (long)leftNetwork.super_object.m_ctx >> 3;
        if (uVar5 <= uVar13) break;
        uVar5 = uVar5 - 1;
        uVar11 = uVar5;
        if (uVar5 < uVar12) {
          uVar11 = uVar12;
        }
        uVar9 = uVar13;
        uVar6 = train->length;
        do {
          iVar2 = *(int *)(*(long *)(&(leftNetwork.super_object.m_ctx)->m_enable_exceptions +
                                    uVar9 * 8) + 0xc);
          uVar7 = uVar6 - iVar2;
          uVar10 = uVar9;
          if (uVar7 == 0 || (int)uVar6 < iVar2) break;
          uVar9 = uVar9 + 1;
          uVar10 = uVar11;
          uVar6 = uVar7;
        } while (uVar9 < uVar5);
        local_58 = uVar12;
        z3::ast_vector_tpl<z3::expr>::ast_vector_tpl(&pathVars,this->c);
        ppEVar4 = (this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppEVar8 = (this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                       _M_impl.super__Vector_impl_data._M_start; ppEVar8 != ppEVar4;
            ppEVar8 = ppEVar8 + 1) {
          uVar12 = uVar13;
          do {
            if (uVar10 < uVar12) {
              z3::ast_vector_tpl<z3::expr>::operator[]
                        ((ast_vector_tpl<z3::expr> *)&local_50,
                         (int)(uVar14 << 4) +
                         (int)(this->occupiedVars).
                              super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[train->id].
                              super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
              z3::operator!((z3 *)&local_80,(expr *)&local_50);
              z3::ast_vector_tpl<z3::expr>::push_back(&pathVars,(expr *)&local_80);
              z3::ast::~ast(&local_80);
              this_00 = &local_50;
              goto LAB_001051e8;
            }
            lVar1 = uVar12 * 8;
            uVar12 = uVar12 + 1;
          } while (*ppEVar8 !=
                   *(Edge **)(&(leftNetwork.super_object.m_ctx)->m_enable_exceptions + lVar1));
          z3::ast_vector_tpl<z3::expr>::operator[]
                    ((ast_vector_tpl<z3::expr> *)&local_80,
                     (int)(uVar14 << 4) +
                     (int)(this->occupiedVars).
                          super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[train->id].
                          super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
          z3::ast_vector_tpl<z3::expr>::push_back(&pathVars,(expr *)&local_80);
          this_00 = &local_80;
LAB_001051e8:
          z3::ast::~ast(this_00);
        }
        z3::mk_and((z3 *)&local_80,&pathVars);
        z3::ast_vector_tpl<z3::expr>::push_back(&lengthHot,(expr *)&local_80);
        z3::ast::~ast(&local_80);
        z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl(&pathVars);
        uVar13 = uVar13 + 1;
        uVar12 = local_58 + 1;
      }
      std::_Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>::~_Vector_base
                ((_Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_> *)&leftNetwork);
      __x = local_60 + 1;
    }
    z3::ast_vector_tpl<z3::expr>::ast_vector_tpl(&leftNetwork,this->c);
    ppEVar4 = (this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppEVar8 = (this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppEVar8 != ppEVar4; ppEVar8 = ppEVar8 + 1) {
      z3::ast_vector_tpl<z3::expr>::operator[]
                ((ast_vector_tpl<z3::expr> *)&local_80,
                 (int)(this->occupiedVars).
                      super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[train->id].
                      super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (int)(uVar14 << 4));
      z3::operator!((z3 *)&pathVars,(expr *)&local_80);
      z3::ast_vector_tpl<z3::expr>::push_back(&leftNetwork,(expr *)&pathVars);
      z3::ast::~ast((ast *)&pathVars);
      z3::ast::~ast(&local_80);
    }
    z3::mk_and((z3 *)&pathVars,&leftNetwork);
    z3::ast_vector_tpl<z3::expr>::push_back(&lengthHot,(expr *)&pathVars);
    z3::ast::~ast((ast *)&pathVars);
    z3::mk_or((z3 *)&pathVars,&lengthHot);
    std::vector<z3::expr,_std::allocator<z3::expr>_>::emplace_back<z3::expr>
              (local_70,(expr *)&pathVars);
    z3::ast::~ast((ast *)&pathVars);
    z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl(&leftNetwork);
    z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl(&lengthHot);
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void Instance::computeLengthConstraint(const Train &train) {
  for (size_t time = train.start.arrivalTime; time < maxTimeSteps; time++) {
    expr_vector lengthHot(*c);
    for (pathType path : trainPaths[train.id]) {
      for (size_t startIndex = 0; startIndex < path.size(); startIndex++) {
        size_t lengthIndex = startIndex;
        int length = train.length;
        do {
          length -= path[lengthIndex]->length;
        } while (length > 0 && ++lengthIndex < path.size() - 1);

        expr_vector pathVars(*c);
        for (const Edge *edge : graph.edges) {
          bool inPath = false;
          for (size_t pathIndex = startIndex; pathIndex <= lengthIndex;
               pathIndex++) {
            if (edge == path[pathIndex]) {
              pathVars.push_back(occupiedVars[train.id][time][edge->id]);
              inPath = true;
              break;
            }
          }
          if (!inPath) {
            pathVars.push_back(!occupiedVars[train.id][time][edge->id]);
          }
        }
        lengthHot.push_back(mk_and(pathVars));
      }
    }
    expr_vector leftNetwork(*c);
    for (const Edge *edge : graph.edges)
      leftNetwork.push_back(!occupiedVars[train.id][time][edge->id]);

    lengthHot.push_back(mk_and(leftNetwork));
    constraints.push_back(mk_or(lengthHot));
  }
}